

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.h
# Opt level: O0

void __thiscall Alg::Alg(Alg *this,Graph *graph,TResult *tRes)

{
  uint32_t uVar1;
  size_t sVar2;
  TResult *tRes_local;
  Graph *graph_local;
  Alg *this_local;
  
  this->__numRRsets = 0;
  this->__is_inf_cost = false;
  this->__boundLast = 1.79769313486232e+308;
  this->__boundMin = 1.79769313486232e+308;
  this->__boundLast_inf = 1.79769313486232e+308;
  this->__boundMin_inf = 1.79769313486232e+308;
  this->__boundLast_inf_cost = 1.79769313486232e+308;
  this->__boundMin_inf_cost = 1.79769313486232e+308;
  HyperGraph::HyperGraph(&this->__hyperG,graph);
  HyperGraph::HyperGraph(&this->__hyperGVldt,graph);
  this->__tRes = tRes;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->__vecSeed);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->__vecSeed_inf);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->__vecSeed_inf_cost);
  uVar1 = HyperGraph::get_nodes(&this->__hyperG);
  this->__numV = uVar1;
  sVar2 = HyperGraph::get_edges(&this->__hyperG);
  this->__numE = sVar2;
  return;
}

Assistant:

Alg(const Graph& graph, TResult& tRes) : __hyperG(graph), __hyperGVldt(graph), __tRes(tRes)
    {
        __numV = __hyperG.get_nodes();
        __numE = __hyperG.get_edges();
    }